

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

string * __thiscall
ICM::to_string_code<10ul>(string *__return_storage_ptr__,ICM *this,ConstDataPointer data)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)this,*(long *)(this + 8) + *(long *)this);
  return __return_storage_ptr__;
}

Assistant:

string to_string_code(ConstDataPointer data) {
		return TypeBase::to_string_code<typename TType<_TU>::Type>(*get<_TU>((void*)data));
	}